

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

void BinaryenMemoryCopySetSource(BinaryenExpressionRef expr,BinaryenExpressionRef sourceExpr)

{
  bool bVar1;
  Expression *expression;
  BinaryenExpressionRef sourceExpr_local;
  BinaryenExpressionRef expr_local;
  
  bVar1 = wasm::Expression::is<wasm::MemoryCopy>(expr);
  if (!bVar1) {
    __assert_fail("expression->is<MemoryCopy>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0xdd7,
                  "void BinaryenMemoryCopySetSource(BinaryenExpressionRef, BinaryenExpressionRef)");
  }
  if (sourceExpr != (BinaryenExpressionRef)0x0) {
    expr[1].type.id = (uintptr_t)sourceExpr;
    return;
  }
  __assert_fail("sourceExpr",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                ,0xdd8,
                "void BinaryenMemoryCopySetSource(BinaryenExpressionRef, BinaryenExpressionRef)");
}

Assistant:

void BinaryenMemoryCopySetSource(BinaryenExpressionRef expr,
                                 BinaryenExpressionRef sourceExpr) {
  auto* expression = (Expression*)expr;
  assert(expression->is<MemoryCopy>());
  assert(sourceExpr);
  static_cast<MemoryCopy*>(expression)->source = (Expression*)sourceExpr;
}